

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O1

int get_option(int argc,char **argv)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  char *__dest;
  byte *__s;
  size_t unaff_R13;
  long lVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long *plVar11;
  char acStack_170 [264];
  char **ppcStack_68;
  byte *pbStack_60;
  size_t sStack_58;
  char *pcStack_50;
  ulong uStack_48;
  code *pcStack_40;
  
  message[0] = '\0';
  if (1 < argc) {
    uVar10 = 1;
    do {
      iVar3 = (int)uVar10;
      __s = (byte *)argv[iVar3];
      if ((*__s | 2) == 0x2f) {
        bVar1 = __s[1];
        if (bVar1 < 0x6f) {
          if (bVar1 != 0x66) {
            if (bVar1 == 0x68) {
              pcStack_40 = (code *)0x10158e;
              usage_exit();
              goto LAB_0010158e;
            }
            goto LAB_0010159a;
          }
          pcStack_40 = (code *)0x1014e5;
          sVar4 = strlen((char *)__s);
          if (2 < sVar4) {
            __s = __s + 2;
            goto LAB_001014ef;
          }
          uVar9 = iVar3 + 1;
          uVar10 = (ulong)uVar9;
          if (argc <= (int)uVar9) goto LAB_001015b7;
          __s = (byte *)argv[(int)uVar9];
          __dest = infile;
        }
        else if (bVar1 == 0x6f) {
          pcStack_40 = (code *)0x101500;
          sVar4 = strlen((char *)__s);
          if (sVar4 < 3) {
            uVar9 = iVar3 + 1;
            uVar10 = (ulong)uVar9;
            if (argc <= (int)uVar9) goto LAB_001015ab;
            __s = (byte *)argv[(int)uVar9];
            __dest = outfile;
          }
          else {
            __s = __s + 2;
            __dest = outfile;
          }
        }
        else {
          if (bVar1 != 0x76) goto LAB_0010159a;
          pcStack_40 = (code *)0x10145d;
          sVar4 = strlen((char *)__s);
          if (sVar4 < 3) {
            uVar9 = iVar3 + 1;
            uVar10 = (ulong)uVar9;
            if (argc <= (int)uVar9) goto LAB_0010159f;
            __s = (byte *)argv[(int)uVar9];
            __dest = voice;
          }
          else {
            __s = __s + 2;
            __dest = voice;
          }
        }
LAB_00101514:
        pcStack_40 = (code *)0x101519;
        strcpy(__dest,(char *)__s);
      }
      else {
        pcStack_40 = (code *)0x10147f;
        unaff_R13 = strlen(message);
        pcStack_40 = (code *)0x10148a;
        sVar4 = strlen((char *)__s);
        if (((sVar4 + unaff_R13) - (ulong)(unaff_R13 == 0)) - 0x103 < 0xfffffffffffffefb) {
LAB_0010158e:
          pcStack_40 = (code *)0x10159a;
          error_exit("too long string.");
LAB_0010159a:
          pcStack_40 = (code *)0x10159f;
          get_option_cold_1();
LAB_0010159f:
          pcStack_40 = (code *)0x1015ab;
          error_exit("option requires an argument -- v");
LAB_001015ab:
          pcStack_40 = (code *)0x1015b7;
          error_exit("option requires an argument -- o");
LAB_001015b7:
          pcStack_40 = print_voice_list;
          error_exit("option requires an argument -- f");
          pcStack_50 = message;
          ppcStack_68 = argv;
          pbStack_60 = __s;
          sStack_58 = unaff_R13;
          uStack_48 = uVar10;
          pcStack_40 = (code *)(ulong)(uint)argc;
          plVar5 = (long *)openjtalk_getHTSVoiceList();
          if (plVar5 == (long *)0x0) {
            lVar8 = 4;
            sVar4 = 0;
          }
          else {
            uVar10 = 0;
            plVar11 = plVar5;
            do {
              sVar4 = strlen((char *)plVar11[2]);
              sVar7 = sVar4;
              if (sVar4 < uVar10) {
                sVar7 = uVar10;
              }
              plVar11 = (long *)*plVar11;
              uVar10 = sVar7;
            } while (plVar11 != (long *)0x0);
            lVar8 = (sVar7 & 0xfffffffffffffffc) + 4;
          }
          iVar3 = (int)sVar4;
          if (plVar5 != (long *)0x0) {
            do {
              sVar4 = strlen((char *)plVar5[2]);
              acStack_170[0] = ' ';
              acStack_170[1] = '\0';
              if (~sVar4 + lVar8 != 0) {
                lVar6 = sVar4 + (1 - lVar8);
                do {
                  sVar4 = strlen(acStack_170);
                  (acStack_170 + sVar4)[0] = ' ';
                  (acStack_170 + sVar4)[1] = '\0';
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 0);
              }
              iVar3 = printf("%s%s%s\n",plVar5[2],acStack_170,plVar5[1]);
              plVar5 = (long *)*plVar5;
            } while (plVar5 != (long *)0x0);
          }
          return iVar3;
        }
        pcStack_40 = (code *)0x1014af;
        _Var2 = check_fullpath((char *)__s);
        if (_Var2) {
LAB_001014ef:
          __dest = infile;
          goto LAB_00101514;
        }
        if (unaff_R13 != 0) {
          pcStack_40 = (code *)0x1014c0;
          sVar4 = strlen(message);
          (message + sVar4)[0] = ' ';
          (message + sVar4)[1] = '\0';
        }
        pcStack_40 = (code *)0x1014d2;
        strcat(message,(char *)__s);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < argc);
  }
  return 0;
}

Assistant:

int get_option(int argc, char *argv[])
{
	message[0] = '\0';
	for (int i = 1; i < argc; i++)
	{
		char *str = argv[i];
		if (str[0] == '-' || str[0] == '/')
		{
			switch (str[1])
			{
			case 'v':
				if (strlen(argv[i]) > 2)
				{
					strcpy(voice, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- v");
					}
					strcpy(voice, argv[++i]);
				}
				break;

			case 'o':
				if (strlen(argv[i]) > 2)
				{
					strcpy(outfile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- o");
					}
					strcpy(outfile, argv[++i]);
				}
				break;

			case 'f':
				if (strlen(argv[i]) > 2)
				{
					strcpy(infile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- f");
					}
					strcpy(infile, argv[++i]);
				}
				break;

			case 'h':
				usage_exit();
				break;

			default:
				fprintf(stderr, "invalid option -- %c\n", str[1]);
				usage_exit();
				break;
			}
		}
		else
		{
			size_t len = strlen(message);
			if (len + (len>0 ? 1 : 0) + strlen(str) + 1> MAX_PATH)
			{
				error_exit("too long string.");
			}
			if (check_fullpath(str))
			{
				strcpy(infile, str);
			}
			else
			{
				if (len > 0)
				{
					strcat(message, " ");
				}
				strcat(message, str);
			}
		}
	}
	return 0;
}